

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffgbytoff(fitsfile *fptr,long gsize,long ngroups,long offset,void *buffer,int *status)

{
  long lVar1;
  fitsfile *fptr_00;
  long lVar2;
  long in_RCX;
  int *in_RDX;
  fitsfile *in_RSI;
  int *in_RDI;
  int *in_R8;
  int *in_R9;
  char *ioptr;
  char *cptr;
  long record;
  long nread;
  long nspace;
  long bufpos;
  long ii;
  int bcurrent;
  fitsfile *local_88;
  fitsfile *local_80;
  void *local_78;
  int *in_stack_ffffffffffffff90;
  int *status_00;
  undefined8 in_stack_ffffffffffffff98;
  long in_stack_ffffffffffffffa0;
  fitsfile *in_stack_ffffffffffffffa8;
  long local_50;
  long local_48;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (*in_R9 < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             (int)((ulong)in_RDI >> 0x20),&in_RSI->HDUposition,in_RDX);
    }
    if (*(int *)(*(long *)(in_RDI + 2) + 0x50) < 0) {
      ffldrc(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,iVar3,in_stack_ffffffffffffff90);
    }
    lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x568 +
                     (long)*(int *)(*(long *)(in_RDI + 2) + 0x50) * 8);
    lVar1 = *(long *)(*(long *)(in_RDI + 2) + 0x40) + lVar2 * -0xb40;
    fptr_00 = (fitsfile *)(0xb40 - lVar1);
    local_78 = (void *)(*(long *)(*(long *)(in_RDI + 2) + 0x560) +
                        (long)(*(int *)(*(long *)(in_RDI + 2) + 0x50) * 0xb40) + lVar1);
    for (local_48 = 1; local_48 < (long)in_RDX; local_48 = local_48 + 1) {
      local_80 = fptr_00;
      if ((long)in_RSI < (long)fptr_00) {
        local_80 = in_RSI;
      }
      memcpy(in_R8,local_78,(size_t)local_80);
      in_R8 = (int *)((long)&local_80->HDUposition + (long)in_R8);
      if ((long)local_80 < (long)in_RSI) {
        lVar2 = lVar2 + 1;
        ffldrc(fptr_00,(long)local_80,(int)((ulong)lVar2 >> 0x20),in_R8);
        local_78 = (void *)(*(long *)(*(long *)(in_RDI + 2) + 0x560) +
                           (long)(*(int *)(*(long *)(in_RDI + 2) + 0x50) * 0xb40));
        local_80 = (fitsfile *)((long)in_RSI - (long)local_80);
        memcpy(in_R8,local_78,(size_t)local_80);
        in_R8 = (int *)((long)&local_80->HDUposition + (long)in_R8);
        local_78 = (void *)((long)&local_80->HDUposition + in_RCX + (long)local_78);
        fptr_00 = (fitsfile *)((0xb40 - in_RCX) - (long)local_80);
      }
      else {
        local_78 = (void *)((long)&local_80->HDUposition + in_RCX + (long)local_78);
        fptr_00 = (fitsfile *)((long)fptr_00 - ((long)&local_80->HDUposition + in_RCX));
      }
      if (((long)fptr_00 < 1) || (0xb40 < (long)fptr_00)) {
        if ((long)fptr_00 < 1) {
          lVar1 = (0xb40 - (long)fptr_00) / 0xb40;
          local_50 = -(long)fptr_00 % 0xb40;
        }
        else {
          lVar1 = -((long)((long)&fptr_00[-1].Fptr + 7) / 0xb40);
          local_50 = 0xb40 - (long)fptr_00 % 0xb40;
        }
        lVar2 = lVar1 + lVar2;
        ffldrc(fptr_00,(long)local_80,(int)((ulong)lVar2 >> 0x20),in_R8);
        fptr_00 = (fitsfile *)(0xb40 - local_50);
        local_78 = (void *)(*(long *)(*(long *)(in_RDI + 2) + 0x560) +
                            (long)(*(int *)(*(long *)(in_RDI + 2) + 0x50) * 0xb40) + local_50);
      }
    }
    local_88 = fptr_00;
    if ((long)in_RSI < (long)fptr_00) {
      local_88 = in_RSI;
    }
    memcpy(in_R8,local_78,(size_t)local_88);
    status_00 = (int *)((long)&local_88->HDUposition + (long)in_R8);
    if ((long)local_88 < (long)in_RSI) {
      ffldrc(fptr_00,(long)local_88,(int)((ulong)(lVar2 + 1) >> 0x20),status_00);
      memcpy(status_00,
             (void *)(*(long *)(*(long *)(in_RDI + 2) + 0x560) +
                     (long)(*(int *)(*(long *)(in_RDI + 2) + 0x50) * 0xb40)),
             (long)in_RSI - (long)local_88);
    }
    *(long *)(*(long *)(in_RDI + 2) + 0x40) =
         *(long *)(*(long *)(in_RDI + 2) + 0x40) + (long)in_RDX * (long)in_RSI +
         ((long)in_RDX + -1) * in_RCX;
    iVar3 = *in_R9;
  }
  else {
    iVar3 = *in_R9;
  }
  return iVar3;
}

Assistant:

int ffgbytoff(fitsfile *fptr, /* I - FITS file pointer                   */
           long gsize,        /* I - size of each group of bytes         */
           long ngroups,      /* I - number of groups to read            */
           long offset,       /* I - size of gap between groups (may be < 0) */
           void *buffer,      /* I - buffer to be filled                 */
           int *status)       /* IO - error status                       */
/*
  get (read) the requested number of bytes from the file, starting at
  the current file position.  This function combines ffmbyt and ffgbyt
  for increased efficiency.
*/
{
    int bcurrent;
    long ii, bufpos, nspace, nread, record;
    char *cptr, *ioptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
    {                              /* so reload the last one that was used */
      ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
    }

    cptr = (char *)buffer;
    bcurrent = (fptr->Fptr)->curbuf;     /* number of the current IO buffer */
    record = (fptr->Fptr)->bufrecnum[bcurrent];  /* zero-indexed record number */
    bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)record * IOBUFLEN)); /* start pos */
    nspace = IOBUFLEN - bufpos;  /* amount of space left in buffer */
    ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;  

    for (ii = 1; ii < ngroups; ii++)  /* read all but the last group */
    {
      /* copy bytes from IO buffer to the user's buffer */
      nread = minvalue(gsize, nspace);
      memcpy(cptr, ioptr, nread);
      cptr += nread;          /* increment buffer pointer */

      if (nread < gsize)        /* entire group did not fit */
      {
        record++;
        ffldrc(fptr, record, REPORT_EOF, status);  /* load next record */
        bcurrent = (fptr->Fptr)->curbuf;
        ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

        nread  = gsize - nread;
        memcpy(cptr, ioptr, nread);
        cptr   += nread;            /* increment buffer pointer */
        ioptr  += (offset + nread); /* increment IO buffer pointer */
        nspace = IOBUFLEN - offset - nread;  /* amount of space left */
      }
      else
      {
        ioptr  += (offset + nread);  /* increment IO bufer pointer */
        nspace -= (offset + nread);
      }

      if (nspace <= 0 || nspace > IOBUFLEN) /* beyond current record? */
      {
        if (nspace <= 0)
        {
          record += ((IOBUFLEN - nspace) / IOBUFLEN); /* new record number */
          bufpos = (-nspace) % IOBUFLEN; /* starting buffer pos */
        }
        else
        {
          record -= ((nspace - 1 ) / IOBUFLEN); /* new record number */
          bufpos = IOBUFLEN - (nspace % IOBUFLEN); /* starting buffer pos */
        }

        ffldrc(fptr, record, REPORT_EOF, status);
        bcurrent = (fptr->Fptr)->curbuf;

        nspace = IOBUFLEN - bufpos;
        ioptr = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN) + bufpos;
      }
    }

    /* now read the last group */
    nread = minvalue(gsize, nspace);
    memcpy(cptr, ioptr, nread);
    cptr += nread;          /* increment buffer pointer */

    if (nread < gsize)        /* entire group did not fit */
    {
      record++;
      ffldrc(fptr, record, REPORT_EOF, status);  /* load next record */
      bcurrent = (fptr->Fptr)->curbuf;
      ioptr   = (fptr->Fptr)->iobuffer + (bcurrent * IOBUFLEN);

      nread  = gsize - nread;
      memcpy(cptr, ioptr, nread);
    }

    (fptr->Fptr)->bytepos = (fptr->Fptr)->bytepos + (ngroups * gsize)
                                  + (ngroups - 1) * offset;
    return(*status);
}